

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

void pica::assertionFailed(char *expr,char *file,long line)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  string message;
  allocator<char> local_2c2;
  allocator<char> local_2c1;
  long *local_2c0;
  undefined8 local_2b8;
  long local_2b0;
  undefined8 uStack_2a8;
  long *local_2a0;
  undefined8 local_298;
  long local_290;
  undefined8 uStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  ulong *local_220;
  long local_218;
  ulong local_210 [2];
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0 [2];
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,expr,&local_2c1);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_1c0,0,(char *)0x0,0x1cdaa1);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_1d0 = *plVar3;
    lStack_1c8 = plVar1[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *plVar3;
    local_1e0 = (long *)*plVar1;
  }
  local_1d8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_270 = *puVar4;
    lStack_268 = plVar1[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *puVar4;
    local_280 = (ulong *)*plVar1;
  }
  local_278 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,file,&local_2c2);
  uVar5 = 0xf;
  if (local_280 != &local_270) {
    uVar5 = local_270;
  }
  if (uVar5 < (ulong)(local_218 + local_278)) {
    uVar5 = 0xf;
    if (local_220 != local_210) {
      uVar5 = local_210[0];
    }
    if (uVar5 < (ulong)(local_218 + local_278)) goto LAB_001acae9;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_280);
  }
  else {
LAB_001acae9:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_220);
  }
  local_2c0 = &local_2b0;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_2b0 = *plVar1;
    uStack_2a8 = puVar2[3];
  }
  else {
    local_2b0 = *plVar1;
    local_2c0 = (long *)*puVar2;
  }
  local_2b8 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_250 = *puVar4;
    lStack_248 = plVar1[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *puVar4;
    local_260 = (ulong *)*plVar1;
  }
  local_258 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::_M_insert<long>((long)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  uVar5 = 0xf;
  if (local_260 != &local_250) {
    uVar5 = local_250;
  }
  if (uVar5 < (ulong)(local_238 + local_258)) {
    uVar5 = 0xf;
    if (local_240 != local_230) {
      uVar5 = local_230[0];
    }
    if ((ulong)(local_238 + local_258) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_260);
      goto LAB_001acc65;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_240);
LAB_001acc65:
  local_2a0 = &local_290;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_290 = *plVar1;
    uStack_288 = puVar2[3];
  }
  else {
    local_290 = *plVar1;
    local_2a0 = (long *)*puVar2;
  }
  local_298 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_2a0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_1f0 = *plVar3;
    lStack_1e8 = plVar1[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar3;
    local_200 = (long *)*plVar1;
  }
  local_1f8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,local_290 + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)local_200,local_1f8);
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  return;
}

Assistant:

void assertionFailed(const char* expr, const char* file, long line)
{
    std::string message = "ERROR: assertion \"" + std::string(expr) + "\" at " + std::string(file) + ":" +
        toString(line) + " failed";
    std::cerr << message;
}